

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  bool bVar1;
  String *str;
  ostream *in_RSI;
  wchar_t in_EDI;
  String *this;
  ostream *in_stack_ffffffffffffffd0;
  String local_20;
  ostream *local_10;
  wchar_t local_8;
  
  str = (String *)(ulong)(uint)in_EDI;
  switch(str) {
  case (String *)0x0:
    std::operator<<(in_RSI,"\\0");
    break;
  default:
    local_10 = in_RSI;
    local_8 = in_EDI;
    bVar1 = IsPrintableAscii(in_EDI);
    if (!bVar1) {
      this = &local_20;
      String::Format((char *)this,"\\x%X",(ulong)(uint)local_8);
      operator<<(in_stack_ffffffffffffffd0,str);
      String::~String(this);
      return kHexEscape;
    }
    std::operator<<(local_10,(char)local_8);
    return kAsIs;
  case (String *)0x7:
    std::operator<<(in_RSI,"\\a");
    break;
  case (String *)0x8:
    std::operator<<(in_RSI,"\\b");
    break;
  case (String *)0x9:
    std::operator<<(in_RSI,"\\t");
    break;
  case (String *)0xa:
    std::operator<<(in_RSI,"\\n");
    break;
  case (String *)0xb:
    std::operator<<(in_RSI,"\\v");
    break;
  case (String *)0xc:
    std::operator<<(in_RSI,"\\f");
    break;
  case (String *)0xd:
    std::operator<<(in_RSI,"\\r");
    break;
  case (String *)0x27:
    std::operator<<(in_RSI,"\\\'");
    break;
  case (String *)0x5c:
    std::operator<<(in_RSI,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << String::Format("\\x%X", static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}